

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

int uECC_compute_public_key(uint8_t *private_key,uint8_t *public_key,uECC_Curve curve)

{
  short sVar1;
  wordcount_t num_words;
  cmpresult_t cVar2;
  uECC_word_t uVar3;
  int iVar4;
  uECC_word_t _private [4];
  uECC_word_t _public [8];
  
  sVar1 = curve->num_n_bits;
  uECC_vli_bytesToNative(_private,private_key,(sVar1 + 7) / 8);
  num_words = (wordcount_t)((sVar1 + 0x3f) / 0x40);
  uVar3 = uECC_vli_isZero(_private,num_words);
  iVar4 = 0;
  if (uVar3 == 0) {
    cVar2 = uECC_vli_cmp(curve->n,_private,num_words);
    if (cVar2 == '\x01') {
      uVar3 = EccPoint_compute_public_key(_public,_private,curve);
      iVar4 = 0;
      if (uVar3 != 0) {
        uECC_vli_nativeToBytes(public_key,(int)curve->num_bytes,_public);
        uECC_vli_nativeToBytes
                  (public_key + curve->num_bytes,(int)curve->num_bytes,_public + curve->num_words);
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

int uECC_compute_public_key(const uint8_t *private_key, uint8_t *public_key, uECC_Curve curve) {
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    uECC_word_t *_private = (uECC_word_t *)private_key;
    uECC_word_t *_public = (uECC_word_t *)public_key;
#else
    uECC_word_t _private[uECC_MAX_WORDS];
    uECC_word_t _public[uECC_MAX_WORDS * 2];
#endif

#if uECC_VLI_NATIVE_LITTLE_ENDIAN == 0
    uECC_vli_bytesToNative(_private, private_key, BITS_TO_BYTES(curve->num_n_bits));
#endif

    /* Make sure the private key is in the range [1, n-1]. */
    if (uECC_vli_isZero(_private, BITS_TO_WORDS(curve->num_n_bits))) {
        return 0;
    }

    if (uECC_vli_cmp(curve->n, _private, BITS_TO_WORDS(curve->num_n_bits)) != 1) {
        return 0;
    }

    /* Compute public key. */
    if (!EccPoint_compute_public_key(_public, _private, curve)) {
        return 0;
    }

#if uECC_VLI_NATIVE_LITTLE_ENDIAN == 0
    uECC_vli_nativeToBytes(public_key, curve->num_bytes, _public);
    uECC_vli_nativeToBytes(
        public_key + curve->num_bytes, curve->num_bytes, _public + curve->num_words);
#endif
    return 1;
}